

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_status(int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  int resetFlag_local;
  int *pHighwater_local;
  int *pCurrent_local;
  int op_local;
  
  if ((op < 0) || (9 < op)) {
    pCurrent_local._4_4_ = sqlite3MisuseError(0x35e5);
  }
  else {
    *pCurrent = sqlite3Stat.nowValue[op];
    *pHighwater = sqlite3Stat.mxValue[op];
    if (resetFlag != 0) {
      sqlite3Stat.mxValue[op] = sqlite3Stat.nowValue[op];
    }
    pCurrent_local._4_4_ = 0;
  }
  return pCurrent_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_status(int op, int *pCurrent, int *pHighwater, int resetFlag){
  wsdStatInit;
  if( op<0 || op>=ArraySize(wsdStat.nowValue) ){
    return SQLITE_MISUSE_BKPT;
  }
  *pCurrent = wsdStat.nowValue[op];
  *pHighwater = wsdStat.mxValue[op];
  if( resetFlag ){
    wsdStat.mxValue[op] = wsdStat.nowValue[op];
  }
  return SQLITE_OK;
}